

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O0

void pnga_free_gatscat_buf(void)

{
  Integer in_stack_00000198;
  char *in_stack_000001a0;
  
  if (GA_prealloc_gatscat == 0) {
    pnga_error(in_stack_000001a0,in_stack_00000198);
  }
  GA_prealloc_gatscat = 0;
  pnga_free((void *)0x1fc190);
  pnga_free((void *)0x1fc19c);
  pnga_free((void *)0x1fc1a8);
  return;
}

Assistant:

void pnga_free_gatscat_buf()
{
  if (!GA_prealloc_gatscat)
    pnga_error("Gather/scatter buffers not allocated",0);
  GA_prealloc_gatscat = 0;
  pnga_free(GA_elems);
  pnga_free(GA_list);
  pnga_free(GA_header);
}